

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

int HSC_Scroll_Char_Forward(FORM *form)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = form->begincol;
  iVar3 = form->current->dcols - (int)form->current->cols;
  iVar4 = iVar3 - iVar1;
  iVar2 = 1;
  if (iVar4 == 0 || iVar3 < iVar1) {
    iVar2 = iVar4;
  }
  if (0 < iVar2) {
    form->curcol = form->curcol + iVar2;
    form->begincol = iVar1 + iVar2;
    return 0;
  }
  return -0xc;
}

Assistant:

static int HSC_Generic(FORM *form, int columns)
{
  FIELD *field = form->current;
  int res = E_REQUEST_DENIED;
  int cols_to_go = (columns > 0 ? columns : -columns);

  if (columns > 0)
    {
      if ((cols_to_go + form->begincol) > (field->dcols - field->cols))
        cols_to_go = field->dcols - field->cols - form->begincol;
      
      if (cols_to_go > 0)
        {
          form->curcol   += cols_to_go;
          form->begincol += cols_to_go;
          res = E_OK;
        }
    }
  else
    {
      if ( cols_to_go > form->begincol )
        cols_to_go = form->begincol;

      if (cols_to_go > 0)
        {
          form->curcol   -= cols_to_go;
          form->begincol -= cols_to_go;
          res = E_OK;
        }
    }
  return(res);
}